

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O3

double YPSpur_md_get_force(YPSpur *spur,double *trans,double *angular)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_50;
  
  local_50.msg_type = 1;
  local_50.pid = (long)spur->pid;
  local_50.type = 0x77;
  local_50.cs = 0;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_50);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_50), -1 < iVar1)) {
    *trans = local_50.data[0];
    *angular = local_50.data[1];
    return local_50.data[2];
  }
  spur->connection_error = 1;
  return -1.0;
}

Assistant:

double YPSpur_md_get_force(YPSpur* spur, double* trans, double* angular)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_FORCE;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *trans = msg.data[0];
  *angular = msg.data[1];
  time = msg.data[2];
  return time;
}